

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void qrhigl_accumulateComputeResource<QHash<QRhiResource*,std::pair<int,bool>>>
               (QHash<QRhiResource_*,_std::pair<int,_bool>_> *writtenResources,
               QRhiResource *resource,Type bindingType,int loadTypeVal,int storeTypeVal,
               int loadStoreTypeVal)

{
  uchar *puVar1;
  Span *pSVar2;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  iterator iVar5;
  QRhiResource *resource_local;
  pair<int,_bool> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 1;
  if (bindingType != loadTypeVal) {
    uVar4 = bindingType == loadStoreTypeVal | 2;
  }
  resource_local = resource;
  iVar5 = QHash<QRhiResource*,std::pair<int,bool>>::findImpl<QRhiResource*>
                    ((QHash<QRhiResource*,std::pair<int,bool>> *)writtenResources,&resource_local);
  if (iVar5.i.d == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0 &&
      iVar5.i.bucket == 0) {
    if (bindingType == storeTypeVal || bindingType == loadStoreTypeVal) {
      local_38.second = true;
      local_38.first = uVar4;
      QHash<QRhiResource*,std::pair<int,bool>>::emplace<std::pair<int,bool>const&>
                ((QHash<QRhiResource*,std::pair<int,bool>> *)writtenResources,&resource_local,
                 &local_38);
    }
  }
  else {
    pSVar2 = (iVar5.i.d)->spans;
    uVar3 = iVar5.i.bucket >> 7;
    puVar1 = pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)iVar5.i.bucket & 0x7f]].storage.data
             + 8;
    *(uint *)puVar1 = *(uint *)puVar1 | uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void qrhigl_accumulateComputeResource(T *writtenResources, QRhiResource *resource,
                                             QRhiShaderResourceBinding::Type bindingType,
                                             int loadTypeVal, int storeTypeVal, int loadStoreTypeVal)
{
    int access = 0;
    if (bindingType == loadTypeVal) {
        access = QGles2CommandBuffer::ComputePassState::Read;
    } else {
        access = QGles2CommandBuffer::ComputePassState::Write;
        if (bindingType == loadStoreTypeVal)
            access |= QGles2CommandBuffer::ComputePassState::Read;
    }
    auto it = writtenResources->find(resource);
    if (it != writtenResources->end())
        it->first |= access;
    else if (bindingType == storeTypeVal || bindingType == loadStoreTypeVal)
        writtenResources->insert(resource, { access, true });
}